

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_keydata.cpp
# Opt level: O2

void __thiscall KeyData_Pubkey1_Test::TestBody(KeyData_Pubkey1_Test *this)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *arr_obj;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *arr_obj_00;
  initializer_list<unsigned_int> __l;
  allocator local_361;
  vector<unsigned_int,_std::allocator<unsigned_int>_> array1;
  ByteData fingerprint1;
  Pubkey pubkey1;
  KeyData obj1;
  KeyData obj2;
  
  std::__cxx11::string::string
            ((string *)&obj1,"021362bdf255b304dcd29bfdb6b5c63c68ef7df60e2b1fc156716efe077b794647",
             (allocator *)&obj2);
  cfd::core::Pubkey::Pubkey(&pubkey1,(string *)&obj1);
  std::__cxx11::string::~string((string *)&obj1);
  std::__cxx11::string::string((string *)&obj1,"12345678",(allocator *)&obj2);
  cfd::core::ByteData::ByteData(&fingerprint1,(string *)&obj1);
  std::__cxx11::string::~string((string *)&obj1);
  obj1.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x100000000;
  obj1.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_finish._0_4_ = 2;
  __l._M_len = 3;
  __l._M_array = (iterator)&obj1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&array1,__l,(allocator_type *)&obj2);
  std::__cxx11::string::string((string *)&obj2,"0/1/2",&local_361);
  cfd::core::KeyData::KeyData(&obj1,&pubkey1,(string *)&obj2,&fingerprint1);
  std::__cxx11::string::~string((string *)&obj2);
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&obj1,(KeyData *)&array1,arr_obj);
  cfd::core::KeyData::KeyData(&obj2,&pubkey1,&array1,&fingerprint1);
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&obj2,(KeyData *)&array1,arr_obj_00);
  cfd::core::KeyData::~KeyData(&obj2);
  cfd::core::KeyData::~KeyData(&obj1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&array1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&fingerprint1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey1);
  return;
}

Assistant:

TEST(KeyData, Pubkey1) {
  Pubkey pubkey1("021362bdf255b304dcd29bfdb6b5c63c68ef7df60e2b1fc156716efe077b794647");
  ByteData fingerprint1("12345678");
  std::vector<uint32_t> array1{0, 1, 2};

  auto check_func = [](const KeyData& obj, const std::vector<uint32_t>& arr_obj) {
    auto obj_arr = obj.GetChildNumArray();
    EXPECT_TRUE(obj.IsValid());
    EXPECT_FALSE(obj.HasPrivkey());
    EXPECT_FALSE(obj.HasExtPubkey());
    EXPECT_FALSE(obj.HasExtPrivkey());
    EXPECT_EQ(arr_obj.size(), obj_arr.size());
    EXPECT_STREQ("0/1/2", obj.GetBip32Path().c_str());
    EXPECT_STREQ("12345678", obj.GetFingerprint().GetHex().c_str());
    EXPECT_STREQ(
        "021362bdf255b304dcd29bfdb6b5c63c68ef7df60e2b1fc156716efe077b794647",
        obj.GetPubkey().GetHex().c_str());
    for (size_t idx=0; idx<arr_obj.size(); ++idx) {
      EXPECT_EQ(arr_obj[idx], obj_arr[idx]);
    }
    EXPECT_STREQ(
        "[12345678/0/1/2]021362bdf255b304dcd29bfdb6b5c63c68ef7df60e2b1fc156716efe077b794647",
        obj.ToString().c_str());
    EXPECT_STREQ("0x0/0x1/0x2",
        obj.GetBip32Path(HardenedType::kApostrophe, true).c_str());
  };

  KeyData obj1(pubkey1, "0/1/2", fingerprint1);
  check_func(obj1, array1);
  KeyData obj2(pubkey1, array1, fingerprint1);
  check_func(obj2, array1);
}